

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  conversion_type cVar1;
  uint uVar2;
  uint uVar3;
  level_details *plVar4;
  sbyte sVar5;
  uint uVar6;
  vector<crnlib::crn_comp::level_details> *in_RDI;
  uint blockHeight;
  uint level;
  image_u8 cooked_image;
  uint level_index_1;
  uint face_index_1;
  conversion_type conv_type;
  uint height;
  uint width;
  uint level_index;
  uint face_index;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int iVar7;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint i;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_60 [12];
  conversion_type in_stack_ffffffffffffffac;
  image_u8 *in_stack_ffffffffffffffb0;
  uint local_2c;
  uint local_28;
  uint local_18;
  uint local_14;
  
  local_14 = 0;
  do {
    if (*(uint *)(*(long *)&in_RDI[0x2c].m_size + 8) <= local_14) {
      cVar1 = image_utils::get_image_conversion_type_from_crn_format
                        (*(crn_format *)(*(long *)&in_RDI[0x2c].m_size + 0x18));
      if (cVar1 != cConversion_Invalid) {
        for (local_28 = 0; local_28 < *(uint *)(*(long *)&in_RDI[0x2c].m_size + 8);
            local_28 = local_28 + 1) {
          for (local_2c = 0; local_2c < *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x14);
              local_2c = local_2c + 1) {
            in_stack_ffffffffffffff78 = local_60;
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (image<crnlib::color_quad<unsigned_char,_int>_> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            image_utils::convert_image(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
            image<crnlib::color_quad<unsigned_char,_int>_>::swap
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (image<crnlib::color_quad<unsigned_char,_int>_> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1ca4b7);
          }
        }
      }
      vector<crnlib::crn_comp::level_details>::resize
                (in_RDI,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
      in_RDI[0x14e].m_size = 0;
      for (i = 0; i < *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x14); i = i + 1) {
        uVar2 = math::maximum<unsigned_int>
                          (1,*(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x10) >> ((byte)i & 0x1f));
        uVar6 = (uVar2 + 7 & 0xfffffff8) >> 2;
        uVar2 = math::maximum<unsigned_int>
                          (1,*(uint *)(*(long *)&in_RDI[0x2c].m_size + 0xc) >> ((byte)i & 0x1f));
        sVar5 = 2;
        if (((ulong)in_RDI[0x14d].m_p & 0x100000000) != 0) {
          sVar5 = 1;
        }
        uVar2 = (uVar2 + 7 & 0xfffffff8) >> sVar5;
        plVar4 = vector<crnlib::crn_comp::level_details>::operator[]
                           ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size,i);
        plVar4->block_width = uVar2;
        uVar3 = in_RDI[0x14e].m_size;
        plVar4 = vector<crnlib::crn_comp::level_details>::operator[]
                           ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size,i);
        plVar4->first_block = uVar3;
        iVar7 = *(int *)(*(long *)&in_RDI[0x2c].m_size + 8);
        plVar4 = vector<crnlib::crn_comp::level_details>::operator[]
                           ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size,i);
        uVar3 = iVar7 * plVar4->block_width * uVar6;
        plVar4 = vector<crnlib::crn_comp::level_details>::operator[]
                           ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size,i);
        plVar4->num_blocks = uVar3;
        plVar4 = vector<crnlib::crn_comp::level_details>::operator[]
                           ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size,i);
        in_RDI[0x14e].m_size = plVar4->num_blocks + in_RDI[0x14e].m_size;
      }
      return true;
    }
    for (local_18 = 0; local_18 < *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x14);
        local_18 = local_18 + 1) {
      math::maximum<unsigned_int>
                (1,*(uint *)(*(long *)&in_RDI[0x2c].m_size + 0xc) >> ((byte)local_18 & 0x1f));
      math::maximum<unsigned_int>
                (1,*(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x10) >> ((byte)local_18 & 0x1f));
      if (*(long *)(*(long *)&in_RDI[0x2c].m_size + 0x28 + (ulong)local_14 * 0x80 +
                   (ulong)local_18 * 8) == 0) {
        return false;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (color_quad<unsigned_char,_int> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI,
                 (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),(uint)in_stack_ffffffffffffff78);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool crn_comp::alias_images() {
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
      if (!m_pParams->m_pImages[face_index][level_index])
        return false;
      m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
    }
  }

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(m_images[face_index][level_index]);
        image_utils::convert_image(cooked_image, conv_type);
        m_images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  m_levels.resize(m_pParams->m_levels);
  m_total_blocks = 0;
  for (uint level = 0; level < m_pParams->m_levels; level++) {
    uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
    m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
    m_levels[level].first_block = m_total_blocks;
    m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
    m_total_blocks += m_levels[level].num_blocks;
  }

  return true;
}